

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::on_finish
          (tag_no_value_t<cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pptVar3;
  undefined8 uVar4;
  string_t *__lhs;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  string *in_stack_fffffffffffffcf8;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  exception_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd38;
  undefined1 uVar5;
  _Alloc_hider in_stack_fffffffffffffd3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  exception_t<cfgfile::string_trait_t> local_211 [10];
  tag_t<cfgfile::string_trait_t> *local_30;
  tag_t<cfgfile::string_trait_t> **local_28;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_20;
  undefined8 local_18;
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  iVar2 = (*in_RDI->_vptr_tag_t[2])();
  local_18 = CONCAT44(extraout_var,iVar2);
  local_20._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)in_stack_fffffffffffffcf8);
  local_28 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    *)in_stack_fffffffffffffcf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffd00,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffcf8);
    if (!bVar1) {
      tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
      return;
    }
    pptVar3 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_20);
    local_30 = *pptVar3;
    bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory(local_30);
    if ((bVar1) &&
       (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffd18), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_20);
  }
  uVar5 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
             (allocator<char> *)in_RDI);
  string_trait_t::from_ascii(in_stack_fffffffffffffcf8);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_30);
  std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
             (allocator<char> *)in_RDI);
  string_trait_t::from_ascii(in_stack_fffffffffffffcf8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  this_00 = local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
             (allocator<char> *)in_RDI);
  string_trait_t::from_ascii(in_stack_fffffffffffffcf8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  __lhs = parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+(__lhs,in_stack_fffffffffffffd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
             (allocator<char> *)in_RDI);
  string_trait_t::from_ascii(in_stack_fffffffffffffcf8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffcf8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  str = (string *)&stack0xfffffffffffffd3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
             (allocator<char> *)in_RDI);
  string_trait_t::from_ascii(str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,CONCAT16(uVar5,in_stack_fffffffffffffd38)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,__lhs);
  __cxa_throw(uVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() +
					Trait::from_ascii( "\". In file \"" ) + info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		this->set_defined();
	}